

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_rawset(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  StkId pTVar3;
  
  pTVar1 = index2adr(L,idx);
  pTVar3 = L->top;
  pTVar2 = luaH_set(L,&((pTVar1->value).gc)->h,pTVar3 + -2);
  pTVar2->value = pTVar3[-1].value;
  pTVar2->tt = pTVar3[-1].tt;
  pTVar3 = L->top;
  if (((3 < pTVar3[-1].tt) && ((((pTVar3[-1].value.gc)->gch).marked & 3) != 0)) &&
     (((((pTVar1->value).gc)->gch).marked & 4) != 0)) {
    luaC_barrierback(L,&((pTVar1->value).gc)->h);
    pTVar3 = L->top;
  }
  L->top = pTVar3 + -2;
  return;
}

Assistant:

LUA_API void lua_rawset (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2adr(L, idx);
  api_check(L, ttistable(t));
  setobj2t(L, luaH_set(L, hvalue(t), L->top-2), L->top-1);
  luaC_barriert(L, hvalue(t), L->top-1);
  L->top -= 2;
  lua_unlock(L);
}